

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::CommandLineInterface::GeneratePluginOutput
          (CommandLineInterface *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *parsed_files,string *plugin_name,string *parameter,GeneratorContext *generator_context,
          string *error)

{
  string *psVar1;
  ZeroCopyOutputStream *pZVar2;
  int iVar3;
  pointer ppFVar4;
  Version *pVVar5;
  const_iterator cVar6;
  mapped_type *program;
  Type *pTVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ZeroCopyOutputStream *output;
  ulong uVar9;
  int index;
  bool bVar10;
  Subprocess subprocess;
  string communicate_error;
  string local_2f0;
  CodedOutputStream writer;
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  already_seen;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  ZeroCopyOutputStream *pZVar8;
  
  CodeGeneratorRequest::CodeGeneratorRequest(&request);
  CodeGeneratorResponse::CodeGeneratorResponse(&response);
  if (parameter->_M_string_length != 0) {
    request._has_bits_.has_bits_[0]._0_1_ = (byte)request._has_bits_.has_bits_[0] | 1;
    if (request.parameter_.ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
      internal::ArenaStringPtr::CreateInstanceNoArena(&request.parameter_,parameter);
    }
    else {
      std::__cxx11::string::_M_assign((string *)request.parameter_.ptr_);
    }
  }
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &already_seen._M_t._M_impl.super__Rb_tree_header._M_header;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppFVar4 = (parsed_files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       already_seen._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((parsed_files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppFVar4) {
    uVar9 = 0;
    do {
      CodeGeneratorRequest::add_file_to_generate(&request,*(string **)ppFVar4[uVar9]);
      GetTransitiveDependencies
                ((parsed_files->
                 super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start[uVar9],true,true,&already_seen,
                 &request.proto_file_);
      uVar9 = uVar9 + 1;
      ppFVar4 = (parsed_files->
                super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(parsed_files->
                                   super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar4 >> 3)
            );
  }
  request._has_bits_.has_bits_[0]._0_1_ = (byte)request._has_bits_.has_bits_[0] | 2;
  if (request.compiler_version_ == (Version *)0x0) {
    pVVar5 = (Version *)operator_new(0x30);
    Version::Version(pVVar5);
    request.compiler_version_ = pVVar5;
  }
  pVVar5 = request.compiler_version_;
  (request.compiler_version_)->major_ = 3;
  (request.compiler_version_)->minor_ = 3;
  (request.compiler_version_)->patch_ = 0;
  ((request.compiler_version_)->_has_bits_).has_bits_[0] =
       ((request.compiler_version_)->_has_bits_).has_bits_[0] | 0xf;
  writer.output_ = (ZeroCopyOutputStream *)&writer.buffer_size_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&writer,"");
  internal::ArenaStringPtr::SetNoArena
            (&pVVar5->suffix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
             (string *)&writer);
  if (writer.output_ != (ZeroCopyOutputStream *)&writer.buffer_size_) {
    operator_delete(writer.output_,writer._16_8_ + 1);
  }
  Subprocess::Subprocess(&subprocess);
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->plugins_)._M_t,plugin_name);
  bVar10 = (_Rb_tree_header *)cVar6._M_node != &(this->plugins_)._M_t._M_impl.super__Rb_tree_header;
  program = plugin_name;
  if (bVar10) {
    program = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->plugins_,plugin_name);
  }
  Subprocess::Start(&subprocess,program,(uint)bVar10);
  communicate_error._M_dataplus._M_p = (pointer)&communicate_error.field_2;
  communicate_error._M_string_length = 0;
  communicate_error.field_2._M_local_buf[0] = '\0';
  bVar10 = Subprocess::Communicate
                     (&subprocess,&request.super_Message,&response.super_Message,&communicate_error)
  ;
  if (bVar10) {
    index = 0;
    if (response.file_.super_RepeatedPtrFieldBase.current_size_ < 1) {
      output = (ZeroCopyOutputStream *)0x0;
    }
    else {
      output = (ZeroCopyOutputStream *)0x0;
      do {
        pTVar7 = internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<google::protobuf::compiler::CodeGeneratorResponse_File>::TypeHandler>
                           (&response.file_.super_RepeatedPtrFieldBase,index);
        if (((pTVar7->insertion_point_).ptr_)->_M_string_length == 0) {
          if (((pTVar7->name_).ptr_)->_M_string_length != 0) {
            if (output != (ZeroCopyOutputStream *)0x0) {
              (*output->_vptr_ZeroCopyOutputStream[1])(output);
              output = (ZeroCopyOutputStream *)0x0;
            }
            iVar3 = (*generator_context->_vptr_GeneratorContext[2])
                              (generator_context,(pTVar7->name_).ptr_);
            pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar3);
            goto LAB_00209491;
          }
          pZVar2 = output;
          if (output == (ZeroCopyOutputStream *)0x0) {
            writer.output_ = (ZeroCopyOutputStream *)(plugin_name->_M_dataplus)._M_p;
            writer.buffer_._0_4_ = (undefined4)plugin_name->_M_string_length;
            local_60.text_ = (pointer)0x0;
            local_60.size_ = -1;
            local_90.text_ = (char *)0x0;
            local_90.size_ = -1;
            local_c0.text_ = (char *)0x0;
            local_c0.size_ = -1;
            local_f0.text_ = (char *)0x0;
            local_f0.size_ = -1;
            local_120.text_ = (char *)0x0;
            local_120.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_180.text_ = (char *)0x0;
            local_180.size_ = -1;
            local_1b0.text_ = (char *)0x0;
            local_1b0.size_ = -1;
            local_1e0.text_ = (char *)0x0;
            local_1e0.size_ = -1;
            strings::Substitute_abi_cxx11_
                      (&local_2f0,
                       (strings *)
                       "$0: First file chunk returned by plugin did not specify a file name.",
                       (char *)&writer,&local_60,&local_90,&local_c0,&local_f0,&local_120,&local_150
                       ,&local_180,&local_1b0,&local_1e0,(SubstituteArg *)error);
            std::__cxx11::string::operator=((string *)error,(string *)&local_2f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            bVar10 = false;
            goto LAB_0020960d;
          }
        }
        else {
          if (output != (ZeroCopyOutputStream *)0x0) {
            (*output->_vptr_ZeroCopyOutputStream[1])(output);
            output = (ZeroCopyOutputStream *)0x0;
          }
          iVar3 = (*generator_context->_vptr_GeneratorContext[4])
                            (generator_context,(pTVar7->name_).ptr_,(pTVar7->insertion_point_).ptr_)
          ;
          pZVar8 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar3);
LAB_00209491:
          pZVar2 = output;
          if ((output != pZVar8) && (pZVar2 = pZVar8, output != (ZeroCopyOutputStream *)0x0)) {
            (*output->_vptr_ZeroCopyOutputStream[1])(output);
          }
        }
        output = pZVar2;
        io::CodedOutputStream::CodedOutputStream(&writer,output);
        psVar1 = (pTVar7->content_).ptr_;
        io::CodedOutputStream::WriteRaw
                  (&writer,(psVar1->_M_dataplus)._M_p,(int)psVar1->_M_string_length);
        io::CodedOutputStream::~CodedOutputStream(&writer);
        index = index + 1;
      } while (index < response.file_.super_RepeatedPtrFieldBase.current_size_);
    }
    bVar10 = (response.error_.ptr_)->_M_string_length == 0;
    if (!bVar10) {
      std::__cxx11::string::_M_assign((string *)error);
    }
LAB_0020960d:
    if (output != (ZeroCopyOutputStream *)0x0) {
      (*output->_vptr_ZeroCopyOutputStream[1])(output);
    }
  }
  else {
    writer.output_ = (ZeroCopyOutputStream *)(plugin_name->_M_dataplus)._M_p;
    writer.buffer_._0_4_ = (undefined4)plugin_name->_M_string_length;
    local_60.text_ = communicate_error._M_dataplus._M_p;
    local_60.size_ = (int)communicate_error._M_string_length;
    local_90.text_ = (char *)0x0;
    local_90.size_ = -1;
    local_c0.text_ = (char *)0x0;
    local_c0.size_ = -1;
    local_f0.text_ = (char *)0x0;
    local_f0.size_ = -1;
    local_120.text_ = (char *)0x0;
    local_120.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    strings::Substitute_abi_cxx11_
              (&local_2f0,(strings *)"$0: $1",(char *)&writer,&local_60,&local_90,&local_c0,
               &local_f0,&local_120,&local_150,&local_180,&local_1b0,&local_1e0,
               (SubstituteArg *)error);
    std::__cxx11::string::operator=((string *)error,(string *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    bVar10 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)communicate_error._M_dataplus._M_p != &communicate_error.field_2) {
    operator_delete(communicate_error._M_dataplus._M_p,
                    CONCAT71(communicate_error.field_2._M_allocated_capacity._1_7_,
                             communicate_error.field_2._M_local_buf[0]) + 1);
  }
  Subprocess::~Subprocess(&subprocess);
  std::
  _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::~_Rb_tree(&already_seen._M_t);
  CodeGeneratorResponse::~CodeGeneratorResponse(&response);
  CodeGeneratorRequest::~CodeGeneratorRequest(&request);
  return bVar10;
}

Assistant:

bool CommandLineInterface::GeneratePluginOutput(
    const std::vector<const FileDescriptor*>& parsed_files,
    const string& plugin_name,
    const string& parameter,
    GeneratorContext* generator_context,
    string* error) {
  CodeGeneratorRequest request;
  CodeGeneratorResponse response;

  // Build the request.
  if (!parameter.empty()) {
    request.set_parameter(parameter);
  }

  std::set<const FileDescriptor*> already_seen;
  for (int i = 0; i < parsed_files.size(); i++) {
    request.add_file_to_generate(parsed_files[i]->name());
    GetTransitiveDependencies(parsed_files[i],
                              true,  // Include json_name for plugins.
                              true,  // Include source code info.
                              &already_seen, request.mutable_proto_file());
  }

  google::protobuf::compiler::Version* version =
      request.mutable_compiler_version();
  version->set_major(GOOGLE_PROTOBUF_VERSION / 1000000);
  version->set_minor(GOOGLE_PROTOBUF_VERSION / 1000 % 1000);
  version->set_patch(GOOGLE_PROTOBUF_VERSION % 1000);
  version->set_suffix(GOOGLE_PROTOBUF_VERSION_SUFFIX);

  // Invoke the plugin.
  Subprocess subprocess;

  if (plugins_.count(plugin_name) > 0) {
    subprocess.Start(plugins_[plugin_name], Subprocess::EXACT_NAME);
  } else {
    subprocess.Start(plugin_name, Subprocess::SEARCH_PATH);
  }

  string communicate_error;
  if (!subprocess.Communicate(request, &response, &communicate_error)) {
    *error = strings::Substitute("$0: $1", plugin_name, communicate_error);
    return false;
  }

  // Write the files.  We do this even if there was a generator error in order
  // to match the behavior of a compiled-in generator.
  google::protobuf::scoped_ptr<io::ZeroCopyOutputStream> current_output;
  for (int i = 0; i < response.file_size(); i++) {
    const CodeGeneratorResponse::File& output_file = response.file(i);

    if (!output_file.insertion_point().empty()) {
      // Open a file for insert.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->OpenForInsert(
          output_file.name(), output_file.insertion_point()));
    } else if (!output_file.name().empty()) {
      // Starting a new file.  Open it.
      // We reset current_output to NULL first so that the old file is closed
      // before the new one is opened.
      current_output.reset();
      current_output.reset(generator_context->Open(output_file.name()));
    } else if (current_output == NULL) {
      *error = strings::Substitute(
        "$0: First file chunk returned by plugin did not specify a file name.",
        plugin_name);
      return false;
    }

    // Use CodedOutputStream for convenience; otherwise we'd need to provide
    // our own buffer-copying loop.
    io::CodedOutputStream writer(current_output.get());
    writer.WriteString(output_file.content());
  }

  // Check for errors.
  if (!response.error().empty()) {
    // Generator returned an error.
    *error = response.error();
    return false;
  }

  return true;
}